

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_f(void *ctx,char *next)

{
  MPP_RET MVar1;
  long number;
  
  if (next != (char *)0x0) {
    number = 0;
    MVar1 = str_to_frm_fmt(next,&number);
    if (MVar1 == MPP_OK) {
      if ((((uint)number >> 0x18 & 1) == 0) &&
         (((number & 0xf0000U) == 0 && ((uint)number & 0xfffc) < 0x14 ||
          (((uint)number & 0x1fff0) < 0x10010 && ((uint)number & 0xf0000) == 0x10000)))) {
        *(uint *)((long)ctx + 0x28) = (uint)number;
        return 1;
      }
      _mpp_log_l(2,"mpi_enc_utils","invalid input format 0x%x\n",0);
    }
  }
  *(undefined4 *)((long)ctx + 0x28) = 0;
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_f(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        long number = 0;
        MppFrameFormat format = MPP_FMT_BUTT;

        if (MPP_OK == str_to_frm_fmt(next, &number)) {
            format = (MppFrameFormat)number;

            if (MPP_FRAME_FMT_IS_BE(format) &&
                (MPP_FRAME_FMT_IS_YUV(format) || MPP_FRAME_FMT_IS_RGB(format))) {
                cmd->format = format;
                return 1;
            }

            mpp_err("invalid input format 0x%x\n", format);
        }
    }

    cmd->format = MPP_FMT_YUV420SP;
    return 0;
}